

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

Token * string(Token *__return_storage_ptr__,Scanner *scanner,char quotation_mark)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  pcVar2 = scanner->current;
  bVar4 = *pcVar2 == '\0';
  if (*pcVar2 != quotation_mark && !bVar4) {
    do {
      pcVar2 = pcVar2 + 1;
      scanner->current = pcVar2;
      bVar4 = *pcVar2 == '\0';
      if (bVar4) break;
    } while (*pcVar2 != quotation_mark);
  }
  if (bVar4) {
    __return_storage_ptr__->type = TOKEN_ERROR;
    __return_storage_ptr__->start = "Unterminated String";
    uVar3 = 0x13;
  }
  else {
    scanner->current = pcVar2 + 1;
    __return_storage_ptr__->type = TOKEN_STRING;
    pcVar1 = scanner->start;
    __return_storage_ptr__->start = pcVar1;
    uVar3 = (ulong)(uint)((int)(pcVar2 + 1) - (int)pcVar1);
  }
  __return_storage_ptr__->length = uVar3;
  __return_storage_ptr__->line = scanner->line;
  return __return_storage_ptr__;
}

Assistant:

static Token string(Scanner *scanner, char quotation_mark) {
    while (!at_end(scanner) && peek(scanner) != quotation_mark) {
        advance(scanner);
    }

    if (at_end(scanner)) {
        return error_token(scanner, "Unterminated String");
    }

    advance(scanner);
    return make_token(scanner, TOKEN_STRING);
}